

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmMakefile *pcVar2;
  bool bVar3;
  char *pcVar4;
  bool bVar5;
  __type _Var6;
  bool bVar7;
  TargetType TVar8;
  int iVar9;
  pointer pcVar10;
  cmMessenger *messenger;
  cmGlobalGenerator *this_00;
  ostream *poVar11;
  _Elt_pointer local_f60;
  byte local_f41;
  string local_db8;
  ostringstream local_d98 [8];
  ostringstream e_7;
  allocator<char> local_c19;
  string local_c18;
  string local_bf8;
  ostringstream local_bd8 [8];
  ostringstream e_6;
  undefined1 local_a60 [8];
  cmListFileBacktrace lfbt_7;
  cmListFileBacktrace lfbt_6;
  cmListFileBacktrace lfbt_5;
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  cmListFileBacktrace lfbt;
  ostringstream local_9c0 [8];
  ostringstream e_5;
  string local_848;
  ostringstream local_828 [8];
  ostringstream e_4;
  string local_6b0;
  ostringstream local_690 [8];
  ostringstream e_3;
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream e_2;
  string local_380;
  ostringstream local_360 [8];
  ostringstream e_1;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream e;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [13];
  _Elt_pointer local_20;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = (_Elt_pointer)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  TVar8 = GetType(this);
  pcVar4 = value_local;
  pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                      (&this->impl);
  messenger = cmMakefile::GetMessenger(pcVar10->Makefile);
  std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
            (&this->impl);
  cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffd0);
  bVar5 = cmTargetPropertyComputer::PassesWhitelist
                    (TVar8,(string *)pcVar4,messenger,
                     (cmListFileBacktrace *)&stack0xffffffffffffffd0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&stack0xffffffffffffffd0);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCOMPILE_DEFINITIONS_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",local_3d);
      std::allocator<char>::~allocator(local_3d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCOMPILE_DEFINITIONS_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_ ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCOMPILE_FEATURES_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",&local_3e);
      std::allocator<char>::~allocator(&local_3e);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCOMPILE_FEATURES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_ ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCOMPILE_OPTIONS_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,"COMPILE_OPTIONS",&local_3f);
      std::allocator<char>::~allocator(&local_3f);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCOMPILE_OPTIONS_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_
         == '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCUDA_PTX_COMPILATION_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCUDA_PTX_COMPILATION_abi_cxx11_,"CUDA_PTX_COMPILATION",&local_40);
      std::allocator<char>::~allocator(&local_40);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCUDA_PTX_COMPILATION_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCUDA_PTX_COMPILATION_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_ == '\0')
       && (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propEXPORT_NAME_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
                 "EXPORT_NAME",&local_41);
      std::allocator<char>::~allocator(&local_41);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propEXPORT_NAME_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_ ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propIMPORTED_GLOBAL_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propIMPORTED_GLOBAL_abi_cxx11_,"IMPORTED_GLOBAL",&local_42);
      std::allocator<char>::~allocator(&local_42);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propIMPORTED_GLOBAL_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propIMPORTED_GLOBAL_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propINCLUDE_DIRECTORIES_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",&local_43);
      std::allocator<char>::~allocator(&local_43);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propINCLUDE_DIRECTORIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_ == '\0')
       && (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propLINK_OPTIONS_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
                 "LINK_OPTIONS",&local_44);
      std::allocator<char>::~allocator(&local_44);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propLINK_OPTIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propLINK_OPTIONS_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_ ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propLINK_DIRECTORIES_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_DIRECTORIES_abi_cxx11_,"LINK_DIRECTORIES",&local_45);
      std::allocator<char>::~allocator(&local_45);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propLINK_DIRECTORIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propLINK_DIRECTORIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_ == '\0'
        ) && (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                           propLINK_LIBRARIES_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_LIBRARIES_abi_cxx11_,"LINK_LIBRARIES",&local_46);
      std::allocator<char>::~allocator(&local_46);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propLINK_LIBRARIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::
         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,"MANUALLY_ADDED_DEPENDENCIES",&local_47
                );
      std::allocator<char>::~allocator(&local_47);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propNAME_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,"NAME",
                 &local_48);
      std::allocator<char>::~allocator(&local_48);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_
                         );
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propSOURCES_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                 "SOURCES",&local_49);
      std::allocator<char>::~allocator(&local_49);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propSOURCES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propTYPE_abi_cxx11_), iVar9 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,"TYPE",
                 &local_4a);
      std::allocator<char>::~allocator(&local_4a);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_
                         );
    }
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,
                            &SetProperty(std::__cxx11::string_const&,char_const*)::
                             propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var6) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::operator<<((ostream *)local_1c8,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
      pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                operator->(&this->impl);
      pcVar2 = pcVar10->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
    }
    else {
      _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,
                              &SetProperty(std::__cxx11::string_const&,char_const*)::
                               propNAME_abi_cxx11_);
      if (_Var6) {
        std::__cxx11::ostringstream::ostringstream(local_360);
        std::operator<<((ostream *)local_360,"NAME property is read-only\n");
        pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                  operator->(&this->impl);
        pcVar2 = pcVar10->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::ostringstream::~ostringstream(local_360);
      }
      else {
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,
                                &SetProperty(std::__cxx11::string_const&,char_const*)::
                                 propTYPE_abi_cxx11_);
        if (_Var6) {
          std::__cxx11::ostringstream::ostringstream(local_4f8);
          std::operator<<((ostream *)local_4f8,"TYPE property is read-only\n");
          pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl);
          pcVar2 = pcVar10->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::ostringstream::~ostringstream(local_4f8);
        }
        else {
          _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,
                                  &SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propEXPORT_NAME_abi_cxx11_);
          if ((_Var6) && (bVar5 = IsImported(this), bVar5)) {
            std::__cxx11::ostringstream::ostringstream(local_690);
            poVar11 = std::operator<<((ostream *)local_690,
                                      "EXPORT_NAME property can\'t be set on imported targets (\"");
            pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
            poVar11 = std::operator<<(poVar11,(string *)&pcVar10->Name);
            std::operator<<(poVar11,"\")\n");
            pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
            pcVar2 = pcVar10->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_6b0);
            std::__cxx11::string::~string((string *)&local_6b0);
            std::__cxx11::ostringstream::~ostringstream(local_690);
          }
          else {
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,
                                    &SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propSOURCES_abi_cxx11_);
            if ((_Var6) && (bVar5 = IsImported(this), bVar5)) {
              std::__cxx11::ostringstream::ostringstream(local_828);
              poVar11 = std::operator<<((ostream *)local_828,
                                        "SOURCES property can\'t be set on imported targets (\"");
              pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
              poVar11 = std::operator<<(poVar11,(string *)&pcVar10->Name);
              std::operator<<(poVar11,"\")\n");
              pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
              pcVar2 = pcVar10->Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_848);
              std::__cxx11::string::~string((string *)&local_848);
              std::__cxx11::ostringstream::~ostringstream(local_828);
            }
            else {
              _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,
                                      &SetProperty(std::__cxx11::string_const&,char_const*)::
                                       propIMPORTED_GLOBAL_abi_cxx11_);
              if ((!_Var6) || (bVar5 = IsImported(this), bVar5)) {
                _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,
                                        &SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propINCLUDE_DIRECTORIES_abi_cxx11_);
                if (_Var6) {
                  pcVar10 = std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&pcVar10->IncludeDirectoriesEntries);
                  pcVar10 = std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&pcVar10->IncludeDirectoriesBacktraces);
                  if (local_20 != (_Elt_pointer)0x0) {
                    pcVar10 = std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pcVar10->IncludeDirectoriesEntries,(char **)&stack0xffffffffffffffe0
                              );
                    std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl);
                    p_Var1 = &lfbt_1.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                    pcVar10 = std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar10->IncludeDirectoriesBacktraces,(value_type *)p_Var1);
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)
                               &lfbt_1.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                }
                else {
                  _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,
                                          &SetProperty(std::__cxx11::string_const&,char_const*)::
                                           propCOMPILE_OPTIONS_abi_cxx11_);
                  if (_Var6) {
                    pcVar10 = std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear(&pcVar10->CompileOptionsEntries);
                    pcVar10 = std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&pcVar10->CompileOptionsBacktraces);
                    if (local_20 != (_Elt_pointer)0x0) {
                      pcVar10 = std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar10->CompileOptionsEntries,
                                 (char **)&stack0xffffffffffffffe0);
                      std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
                      p_Var1 = &lfbt_2.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount;
                      cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                      pcVar10 = std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar10->CompileOptionsBacktraces,(value_type *)p_Var1);
                      cmListFileBacktrace::~cmListFileBacktrace
                                ((cmListFileBacktrace *)
                                 &lfbt_2.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                  }
                  else {
                    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,
                                            &SetProperty(std::__cxx11::string_const&,char_const*)::
                                             propCOMPILE_FEATURES_abi_cxx11_);
                    if (_Var6) {
                      pcVar10 = std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&pcVar10->CompileFeaturesEntries);
                      pcVar10 = std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&pcVar10->CompileFeaturesBacktraces);
                      if (local_20 != (_Elt_pointer)0x0) {
                        pcVar10 = std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&pcVar10->CompileFeaturesEntries,
                                   (char **)&stack0xffffffffffffffe0);
                        std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
                        p_Var1 = &lfbt_3.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount;
                        cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                        pcVar10 = std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&pcVar10->CompileFeaturesBacktraces,(value_type *)p_Var1);
                        cmListFileBacktrace::~cmListFileBacktrace
                                  ((cmListFileBacktrace *)
                                   &lfbt_3.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
                    }
                    else {
                      _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value_local,
                                              &SetProperty(std::__cxx11::string_const&,char_const*)
                                               ::propCOMPILE_DEFINITIONS_abi_cxx11_);
                      if (_Var6) {
                        pcVar10 = std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear(&pcVar10->CompileDefinitionsEntries);
                        pcVar10 = std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        clear(&pcVar10->CompileDefinitionsBacktraces);
                        if (local_20 != (_Elt_pointer)0x0) {
                          pcVar10 = std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<char_const*&>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&pcVar10->CompileDefinitionsEntries,
                                     (char **)&stack0xffffffffffffffe0);
                          std::
                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                          operator->(&this->impl);
                          p_Var1 = &lfbt_4.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount;
                          cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                          pcVar10 = std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&pcVar10->CompileDefinitionsBacktraces,(value_type *)p_Var1);
                          cmListFileBacktrace::~cmListFileBacktrace
                                    ((cmListFileBacktrace *)
                                     &lfbt_4.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                      }
                      else {
                        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)value_local,
                                                &SetProperty(std::__cxx11::string_const&,char_const*)
                                                 ::propLINK_OPTIONS_abi_cxx11_);
                        if (_Var6) {
                          pcVar10 = std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::clear(&pcVar10->LinkOptionsEntries);
                          pcVar10 = std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          clear(&pcVar10->LinkOptionsBacktraces);
                          if (local_20 != (_Elt_pointer)0x0) {
                            pcVar10 = std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pcVar10->LinkOptionsEntries,
                                       (char **)&stack0xffffffffffffffe0);
                            std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                            p_Var1 = &lfbt_5.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount;
                            cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                            pcVar10 = std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar10->LinkOptionsBacktraces,(value_type *)p_Var1);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_5.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                        else {
                          _Var6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_DIRECTORIES_abi_cxx11_);
                          if (_Var6) {
                            pcVar10 = std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&pcVar10->LinkDirectoriesEntries);
                            pcVar10 = std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            clear(&pcVar10->LinkDirectoriesBacktraces);
                            if (local_20 != (_Elt_pointer)0x0) {
                              pcVar10 = std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<char_const*&>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)&pcVar10->LinkDirectoriesEntries,
                                         (char **)&stack0xffffffffffffffe0);
                              std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                              p_Var1 = &lfbt_6.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                              cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                              pcVar10 = std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                              ::push_back(&pcVar10->LinkDirectoriesBacktraces,(value_type *)p_Var1);
                              cmListFileBacktrace::~cmListFileBacktrace
                                        ((cmListFileBacktrace *)
                                         &lfbt_6.TopEntry.
                                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                            }
                          }
                          else {
                            _Var6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_LIBRARIES_abi_cxx11_);
                            if (_Var6) {
                              pcVar10 = std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::clear(&pcVar10->LinkImplementationPropertyEntries);
                              pcVar10 = std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                              ::clear(&pcVar10->LinkImplementationPropertyBacktraces);
                              if (local_20 != (_Elt_pointer)0x0) {
                                std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                                cmMakefile::GetBacktrace
                                          ((cmMakefile *)
                                           &lfbt_7.TopEntry.
                                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                                pcVar10 = std::
                                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ::operator->(&this->impl);
                                std::
                                vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                                emplace_back<char_const*&>
                                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                            *)&pcVar10->LinkImplementationPropertyEntries,
                                           (char **)&stack0xffffffffffffffe0);
                                pcVar10 = std::
                                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ::operator->(&this->impl);
                                std::
                                vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                                push_back(&pcVar10->LinkImplementationPropertyBacktraces,
                                          (value_type *)
                                          &lfbt_7.TopEntry.
                                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                                cmListFileBacktrace::~cmListFileBacktrace
                                          ((cmListFileBacktrace *)
                                           &lfbt_7.TopEntry.
                                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                              }
                            }
                            else {
                              _Var6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propSOURCES_abi_cxx11_);
                              if (_Var6) {
                                pcVar10 = std::
                                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ::operator->(&this->impl);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::clear(&pcVar10->SourceEntries);
                                pcVar10 = std::
                                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ::operator->(&this->impl);
                                std::
                                vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                                clear(&pcVar10->SourceBacktraces);
                                if (local_20 != (_Elt_pointer)0x0) {
                                  std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                                  cmMakefile::GetBacktrace((cmMakefile *)local_a60);
                                  pcVar10 = std::
                                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ::operator->(&this->impl);
                                  std::
                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  ::emplace_back<char_const*&>
                                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                              *)&pcVar10->SourceEntries,
                                             (char **)&stack0xffffffffffffffe0);
                                  pcVar10 = std::
                                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ::operator->(&this->impl);
                                  std::
                                  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                                  ::push_back(&pcVar10->SourceBacktraces,(value_type *)local_a60);
                                  cmListFileBacktrace::~cmListFileBacktrace
                                            ((cmListFileBacktrace *)local_a60);
                                }
                              }
                              else {
                                _Var6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propIMPORTED_GLOBAL_abi_cxx11_);
                                if (_Var6) {
                                  bVar5 = cmSystemTools::IsOn((char *)local_20);
                                  if (bVar5) {
                                    pcVar10 = std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                    if ((pcVar10->ImportedGloballyVisible & 1U) == 0) {
                                      pcVar10 = std::
                                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ::operator->(&this->impl);
                                      pcVar10->ImportedGloballyVisible = true;
                                      this_00 = GetGlobalGenerator(this);
                                      cmGlobalGenerator::IndexTarget(this_00,this);
                                    }
                                  }
                                  else {
                                    std::__cxx11::ostringstream::ostringstream(local_bd8);
                                    poVar11 = std::operator<<((ostream *)local_bd8,
                                                                                                                            
                                                  "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\""
                                                  );
                                    pcVar10 = std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                    poVar11 = std::operator<<(poVar11,(string *)&pcVar10->Name);
                                    std::operator<<(poVar11,"\")\n");
                                    pcVar10 = std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                    pcVar2 = pcVar10->Makefile;
                                    std::__cxx11::ostringstream::str();
                                    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_bf8);
                                    std::__cxx11::string::~string((string *)&local_bf8);
                                    std::__cxx11::ostringstream::~ostringstream(local_bd8);
                                  }
                                }
                                else {
                                  bVar7 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                                    ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,(char (*) [17])"IMPORTED_LIBNAME");
                                  bVar3 = false;
                                  bVar5 = false;
                                  local_f41 = 0;
                                  if (bVar7) {
                                    pcVar10 = std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                    pcVar4 = value_local;
                                    if (local_20 == (_Elt_pointer)0x0) {
                                      local_f60 = (_Elt_pointer)0x96a110;
                                    }
                                    else {
                                      local_f60 = local_20;
                                    }
                                    std::allocator<char>::allocator();
                                    bVar3 = true;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_c18,(char *)local_f60,&local_c19);
                                    bVar5 = true;
                                    bVar7 = cmTargetInternals::CheckImportedLibName
                                                      (pcVar10,(string *)pcVar4,&local_c18);
                                    local_f41 = bVar7 ^ 0xff;
                                  }
                                  if (bVar5) {
                                    std::__cxx11::string::~string((string *)&local_c18);
                                  }
                                  if (bVar3) {
                                    std::allocator<char>::~allocator(&local_c19);
                                  }
                                  if ((local_f41 & 1) == 0) {
                                    _Var6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCUDA_PTX_COMPILATION_abi_cxx11_);
                                    if ((_Var6) && (TVar8 = GetType(this), TVar8 != OBJECT_LIBRARY))
                                    {
                                      std::__cxx11::ostringstream::ostringstream(local_d98);
                                      poVar11 = std::operator<<((ostream *)local_d98,
                                                                                                                                
                                                  "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                  );
                                      pcVar10 = std::
                                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ::operator->(&this->impl);
                                      poVar11 = std::operator<<(poVar11,(string *)&pcVar10->Name);
                                      std::operator<<(poVar11,"\")\n");
                                      pcVar10 = std::
                                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ::operator->(&this->impl);
                                      pcVar2 = pcVar10->Makefile;
                                      std::__cxx11::ostringstream::str();
                                      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_db8);
                                      std::__cxx11::string::~string((string *)&local_db8);
                                      std::__cxx11::ostringstream::~ostringstream(local_d98);
                                    }
                                    else {
                                      pcVar10 = std::
                                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ::operator->(&this->impl);
                                      cmPropertyMap::SetProperty
                                                (&pcVar10->Properties,(string *)value_local,
                                                 (char *)local_20);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_9c0);
                poVar11 = std::operator<<((ostream *)local_9c0,
                                          "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\""
                                         );
                pcVar10 = std::
                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                          operator->(&this->impl);
                poVar11 = std::operator<<(poVar11,(string *)&pcVar10->Name);
                std::operator<<(poVar11,"\")\n");
                pcVar10 = std::
                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                          operator->(&this->impl);
                pcVar2 = pcVar10->Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage
                          (pcVar2,FATAL_ERROR,
                           (string *)
                           &lfbt.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::string::~string
                          ((string *)
                           &lfbt.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::ostringstream::~ostringstream(local_9c0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, impl->Makefile->GetMessenger(),
        impl->Makefile->GetBacktrace())) {
    return;
  }
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(CUDA_PTX_COMPILATION);
  MAKE_STATIC_PROP(EXPORT_NAME);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
  MAKE_STATIC_PROP(TYPE);
#undef MAKE_STATIC_PROP
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propNAME) {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propTYPE) {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << impl->Name
      << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    impl->IncludeDirectoriesEntries.clear();
    impl->IncludeDirectoriesBacktraces.clear();
    if (value) {
      impl->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    impl->CompileOptionsEntries.clear();
    impl->CompileOptionsBacktraces.clear();
    if (value) {
      impl->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    impl->CompileFeaturesEntries.clear();
    impl->CompileFeaturesBacktraces.clear();
    if (value) {
      impl->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    impl->CompileDefinitionsEntries.clear();
    impl->CompileDefinitionsBacktraces.clear();
    if (value) {
      impl->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    impl->LinkOptionsEntries.clear();
    impl->LinkOptionsBacktraces.clear();
    if (value) {
      impl->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    impl->LinkDirectoriesEntries.clear();
    impl->LinkDirectoriesBacktraces.clear();
    if (value) {
      impl->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    impl->LinkImplementationPropertyEntries.clear();
    impl->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkImplementationPropertyEntries.emplace_back(value);
      impl->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == propSOURCES) {
    impl->SourceEntries.clear();
    impl->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->SourceEntries.emplace_back(value);
      impl->SourceBacktraces.push_back(lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmSystemTools::IsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << impl->Name << "\")\n";
      impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!impl->ImportedGloballyVisible) {
      impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !impl->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else {
    impl->Properties.SetProperty(prop, value);
  }
}